

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O0

void __thiscall DMenu::Drawer(DMenu *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *texname;
  FTexture *this_00;
  int local_38;
  int local_34;
  int y;
  int x;
  int h;
  int w;
  FTexture *tex;
  DMenu *this_local;
  
  if ((((this == CurrentMenu) && (0.0 < BackbuttonAlpha)) &&
      (iVar1 = FIntCVar::operator_cast_to_int(&m_show_backbutton), -1 < iVar1)) &&
     (iVar1 = FIntCVar::operator_cast_to_int(&m_use_mouse), iVar1 != 0)) {
    texname = FString::operator_cast_to_char_(&gameinfo.mBackButton);
    this_00 = FTextureManager::operator()(&TexMan,texname);
    iVar1 = FTexture::GetScaledWidth(this_00);
    iVar1 = iVar1 * CleanXfac;
    iVar2 = FTexture::GetScaledHeight(this_00);
    iVar2 = iVar2 * CleanYfac;
    uVar3 = FIntCVar::operator_cast_to_int(&m_show_backbutton);
    if ((uVar3 & 1) == 0) {
      local_34 = 0;
    }
    else {
      local_34 = DCanvas::GetWidth((DCanvas *)screen);
      local_34 = local_34 - iVar1;
    }
    uVar3 = FIntCVar::operator_cast_to_int(&m_show_backbutton);
    if ((uVar3 & 2) == 0) {
      local_38 = 0;
    }
    else {
      local_38 = DCanvas::GetHeight((DCanvas *)screen);
      local_38 = local_38 - iVar2;
    }
    if ((((this->super_DObject).field_0x25 & 1) == 0) ||
       ((((this->super_DObject).field_0x24 & 1) == 0 &&
        (iVar1 = FIntCVar::operator_cast_to_int(&m_use_mouse), iVar1 != 1)))) {
      DCanvas::DrawTexture
                ((DCanvas *)screen,this_00,(double)local_34,(double)local_38,0x40001393,
                 (double)BackbuttonAlpha,1,0x4000138c,0);
    }
    else {
      DCanvas::DrawTexture
                ((DCanvas *)screen,this_00,(double)local_34,(double)local_38,0x40001393,1,0x400013aa
                 ,0x28ffffff,0);
    }
  }
  return;
}

Assistant:

void DMenu::Drawer () 
{
	if (this == DMenu::CurrentMenu && BackbuttonAlpha > 0 && m_show_backbutton >= 0 && m_use_mouse)
	{
		FTexture *tex = TexMan(gameinfo.mBackButton);
		int w = tex->GetScaledWidth() * CleanXfac;
		int h = tex->GetScaledHeight() * CleanYfac;
		int x = (!(m_show_backbutton&1))? 0:screen->GetWidth() - w;
		int y = (!(m_show_backbutton&2))? 0:screen->GetHeight() - h;
		if (mBackbuttonSelected && (mMouseCapture || m_use_mouse == 1))
		{
			screen->DrawTexture(tex, x, y, DTA_CleanNoMove, true, DTA_ColorOverlay, MAKEARGB(40, 255,255,255), TAG_DONE);
		}
		else
		{
			screen->DrawTexture(tex, x, y, DTA_CleanNoMove, true, DTA_AlphaF, BackbuttonAlpha, TAG_DONE);
		}
	}
}